

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

xmlParserInputPtr xmlSAX2ResolveEntity(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  xmlChar *URL;
  xmlChar *local_48;
  char *base;
  xmlChar *URI;
  xmlParserInputPtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  void *ctx_local;
  
  local_48 = (xmlChar *)0x0;
  if (ctx == (void *)0x0) {
    ctx_local = (void *)0x0;
  }
  else {
    if (*(long *)((long)ctx + 0x38) != 0) {
      local_48 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8);
    }
    if (local_48 == (xmlChar *)0x0) {
      local_48 = *(xmlChar **)((long)ctx + 0x118);
    }
    URL = xmlBuildURI(systemId,local_48);
    ctx_local = xmlLoadExternalEntity((char *)URL,(char *)publicId,(xmlParserCtxtPtr)ctx);
    if (URL != (xmlChar *)0x0) {
      (*xmlFree)(URL);
    }
  }
  return (xmlParserInputPtr)ctx_local;
}

Assistant:

xmlParserInputPtr
xmlSAX2ResolveEntity(void *ctx, const xmlChar *publicId, const xmlChar *systemId)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr ret;
    xmlChar *URI;
    const char *base = NULL;

    if (ctx == NULL) return(NULL);
    if (ctxt->input != NULL)
	base = ctxt->input->filename;
    if (base == NULL)
	base = ctxt->directory;

    URI = xmlBuildURI(systemId, (const xmlChar *) base);

#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2ResolveEntity(%s, %s)\n", publicId, systemId);
#endif

    ret = xmlLoadExternalEntity((const char *) URI,
				(const char *) publicId, ctxt);
    if (URI != NULL)
	xmlFree(URI);
    return(ret);
}